

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O0

void icu_63::Transliterator::registerFactory(UnicodeString *id,Factory factory,Token context)

{
  UBool UVar1;
  UErrorCode local_2c;
  UErrorCode ec;
  Mutex lock;
  Factory factory_local;
  UnicodeString *id_local;
  Token context_local;
  
  lock.fMutex = (UMutex *)factory;
  Mutex::Mutex((Mutex *)&stack0xffffffffffffffd8,&registryMutex);
  local_2c = U_ZERO_ERROR;
  if (registry == (TransliteratorRegistry *)0x0) {
    UVar1 = initializeRegistry(&local_2c);
    if (UVar1 == '\0') goto LAB_002e4b4e;
  }
  _registerFactory(id,(Factory)lock.fMutex,context);
LAB_002e4b4e:
  Mutex::~Mutex((Mutex *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void U_EXPORT2 Transliterator::registerFactory(const UnicodeString& id,
                                     Transliterator::Factory factory,
                                     Transliterator::Token context) {
    Mutex lock(&registryMutex);
    UErrorCode ec = U_ZERO_ERROR;
    if (HAVE_REGISTRY(ec)) {
        _registerFactory(id, factory, context);
    }
}